

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

MethodHandle * __thiscall
jsonrpccxx::methodHandle<std::vector<Product,std::allocator<Product>>>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          function<std::vector<Product,_std::allocator<Product>_>_()> *method)

{
  function<std::vector<Product,_std::allocator<Product>_>_()> local_30;
  
  std::function<std::vector<Product,_std::allocator<Product>_>_()>::function
            (&local_30,(function<std::vector<Product,_std::allocator<Product>_>_()> *)this);
  createMethodHandle<std::vector<Product,_std::allocator<Product>_>_>
            (__return_storage_ptr__,&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle methodHandle(std::function<ReturnType(ParamTypes...)> method) {
    return createMethodHandle(method, std::index_sequence_for<ParamTypes...>{});
  }